

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationFastLatinBuilder::inSameGroup
          (CollationFastLatinBuilder *this,uint32_t p,uint32_t q)

{
  uint uVar1;
  uint32_t *puVar2;
  
  uVar1 = this->firstShortPrimary;
  if (uVar1 <= p) {
    return uVar1 <= q;
  }
  if (uVar1 <= q) {
    return '\0';
  }
  uVar1 = this->lastSpecialPrimaries[3];
  if (uVar1 < p || uVar1 < q) {
    return uVar1 < p && uVar1 < q;
  }
  uVar1 = this->lastSpecialPrimaries[0];
  if (uVar1 < p) {
    puVar2 = this->lastSpecialPrimaries;
    do {
      puVar2 = puVar2 + 1;
      if (q <= uVar1) {
        return '\0';
      }
      uVar1 = *puVar2;
    } while (uVar1 < p);
  }
  return q <= uVar1;
}

Assistant:

UBool
CollationFastLatinBuilder::inSameGroup(uint32_t p, uint32_t q) const {
    // Both or neither need to be encoded as short primaries,
    // so that we can test only one and use the same bit mask.
    if(p >= firstShortPrimary) {
        return q >= firstShortPrimary;
    } else if(q >= firstShortPrimary) {
        return FALSE;
    }
    // Both or neither must be potentially-variable,
    // so that we can test only one and determine if both are variable.
    uint32_t lastVariablePrimary = lastSpecialPrimaries[NUM_SPECIAL_GROUPS - 1];
    if(p > lastVariablePrimary) {
        return q > lastVariablePrimary;
    } else if(q > lastVariablePrimary) {
        return FALSE;
    }
    // Both will be encoded with long mini primaries.
    // They must be in the same special reordering group,
    // so that we can test only one and determine if both are variable.
    U_ASSERT(p != 0 && q != 0);
    for(int32_t i = 0;; ++i) {  // will terminate
        uint32_t lastPrimary = lastSpecialPrimaries[i];
        if(p <= lastPrimary) {
            return q <= lastPrimary;
        } else if(q <= lastPrimary) {
            return FALSE;
        }
    }
}